

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O2

_Bool sparc_cpu_tlb_fill_sparc
                (CPUState *cs,vaddr address,int size,MMUAccessType access_type,int mmu_idx,
                _Bool probe,uintptr_t retaddr)

{
  uint uVar1;
  undefined7 in_register_00000089;
  uint vaddr;
  undefined4 uStack_38;
  int access_index;
  int local_30;
  target_ulong_conflict page_size;
  hwaddr paddr;
  
  if ((int)CONCAT71(in_register_00000089,probe) != 0) {
    __assert_fail("!probe",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/sparc/mmu_helper.c"
                  ,0xdc,
                  "_Bool sparc_cpu_tlb_fill_sparc(CPUState *, vaddr, int, MMUAccessType, int, _Bool, uintptr_t)"
                 );
  }
  vaddr = (uint)address & 0xfffff000;
  uVar1 = get_physical_address
                    ((CPUSPARCState *)(cs[1].tb_jmp_cache + 0xe7),&paddr,&local_30,&access_index,
                     (MemTxAttrs *)(ulong)vaddr,access_type,mmu_idx,(int)&page_size,
                     (target_ulong_conflict *)CONCAT44(access_index,uStack_38));
  if (uVar1 != 0) {
    *(uint *)((long)cs[1].tb_jmp_cache + 0x1064) =
         access_index << 5 | (uint)(*(int *)((long)cs[1].tb_jmp_cache + 0x1064) != 0) | uVar1 | 2;
    *(uint *)(cs[1].tb_jmp_cache + 0x20d) = vaddr;
    if ((((ulong)cs[1].tb_jmp_cache[0x20b] & 2) == 0) &&
       (*(int *)((long)cs[1].tb_jmp_cache + 0x81c) != 0)) {
      cs->exception_index = (uint)(access_type != MMU_INST_FETCH) * 8 + 1;
      cpu_loop_exit_restore_sparc(cs,retaddr);
    }
    local_30 = 7;
    page_size = 0x1000;
  }
  tlb_set_page_sparc(cs,vaddr,paddr,local_30,mmu_idx,page_size);
  return true;
}

Assistant:

bool sparc_cpu_tlb_fill(CPUState *cs, vaddr address, int size,
                        MMUAccessType access_type, int mmu_idx,
                        bool probe, uintptr_t retaddr)
{
    SPARCCPU *cpu = SPARC_CPU(cs);
    CPUSPARCState *env = &cpu->env;
    hwaddr paddr;
    target_ulong vaddr;
    target_ulong page_size;
    int error_code = 0, prot, access_index;
    MemTxAttrs attrs = { 0 };

    /*
     * TODO: If we ever need tlb_vaddr_to_host for this target,
     * then we must figure out how to manipulate FSR and FAR
     * when both MMU_NF and probe are set.  In the meantime,
     * do not support this use case.
     */
    assert(!probe);

    address &= TARGET_PAGE_MASK;
    error_code = get_physical_address(env, &paddr, &prot, &access_index, &attrs,
                                      address, access_type,
                                      mmu_idx, &page_size);
    vaddr = address;
    if (likely(error_code == 0)) {
        qemu_log_mask(CPU_LOG_MMU,
                      "Translate at %" VADDR_PRIx " -> "
                      TARGET_FMT_plx ", vaddr " TARGET_FMT_lx "\n",
                      address, paddr, vaddr);
        tlb_set_page(cs, vaddr, paddr, prot, mmu_idx, page_size);
        return true;
    }

    if (env->mmuregs[3]) { /* Fault status register */
        env->mmuregs[3] = 1; /* overflow (not read before another fault) */
    }
    env->mmuregs[3] |= (access_index << 5) | error_code | 2;
    env->mmuregs[4] = address; /* Fault address register */

    if ((env->mmuregs[0] & MMU_NF) || env->psret == 0)  {
        /* No fault mode: if a mapping is available, just override
           permissions. If no mapping is available, redirect accesses to
           neverland. Fake/overridden mappings will be flushed when
           switching to normal mode. */
        prot = PAGE_READ | PAGE_WRITE | PAGE_EXEC;
        tlb_set_page(cs, vaddr, paddr, prot, mmu_idx, TARGET_PAGE_SIZE);
        return true;
    } else {
        if (access_type == MMU_INST_FETCH) {
            cs->exception_index = TT_TFAULT;
        } else {
            cs->exception_index = TT_DFAULT;
        }
        cpu_loop_exit_restore(cs, retaddr);
    }
}